

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractConsumerStage.h
# Opt level: O0

void __thiscall
teetime::
AbstractConsumerStage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::execute(AbstractConsumerStage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined1 local_38 [8];
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  AbstractConsumerStage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  v._32_8_ = this;
  if (this->m_inputport ==
      (InputPort<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
      )0x0) {
    __assert_fail("m_inputport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/teetime-framework[P]TeeTime-Cpp-Examples/3rdParty/teetime/src/../include/teetime/stages/AbstractConsumerStage.h"
                  ,0x41,
                  "virtual void teetime::AbstractConsumerStage<std::basic_string<char>>::execute() [T = std::basic_string<char>]"
                 );
  }
  InputPort<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  receive((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_38,this->m_inputport);
  bVar1 = Optional::operator_cast_to_bool((Optional *)local_38);
  if (bVar1) {
    pbVar2 = Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_38);
    (*(this->super_AbstractStage)._vptr_AbstractStage[4])(this,pbVar2);
  }
  else {
    bVar1 = InputPort<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::isClosed(this->m_inputport);
    if (bVar1) {
      AbstractStage::terminate(&this->super_AbstractStage);
    }
    else {
      std::this_thread::yield();
    }
  }
  Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Optional((Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_38);
  return;
}

Assistant:

virtual void execute() override final
    {
      assert(m_inputport);

      //TEETIME_DEBUG() << "'execute' stage";
      auto v = m_inputport->receive();
      if(v)
      {
        execute(std::move(*v));
      }
      else if(m_inputport->isClosed())
      {
        terminate();
      }
      else
      {
        std::this_thread::yield();
      }
    }